

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::GetElementIIntIndex
              (Var instance,Var index,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  PropertyQueryFlags PVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  JavascriptArray *arr;
  JavascriptNativeFloatArray *arr_00;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  JavascriptNativeIntArray *arr_01;
  TypedArray<double,_false,_true> *this_01;
  TypedArray<int,_false,_true> *this_02;
  TypedArray<short,_false,_true> *this_03;
  TypedArray<unsigned_char,_false,_true> *this_04;
  TypedArray<char,_false,_true> *this_05;
  TypedArray<float,_false,_true> *this_06;
  TypedArray<unsigned_char,_true,_true> *this_07;
  TypedArray<unsigned_short,_false,_true> *this_08;
  TypedArray<unsigned_int,_false,_true> *this_09;
  TypedArray<double,_false,_false> *this_10;
  TypedArray<int,_false,_false> *this_11;
  TypedArray<short,_false,_false> *this_12;
  TypedArray<unsigned_char,_false,_false> *this_13;
  TypedArray<char,_false,_false> *this_14;
  TypedArray<float,_false,_false> *this_15;
  TypedArray<unsigned_char,_true,_false> *this_16;
  TypedArray<unsigned_short,_false,_false> *this_17;
  TypedArray<unsigned_int,_false,_false> *this_18;
  JavascriptString *this_19;
  Var pvVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  char *fileName;
  bool bVar13;
  bool bVar14;
  Var local_48;
  Var result;
  Var local_38;
  
  uVar11 = (ulong)index & 0xffff000000000000;
  bVar13 = uVar11 != 0x1000000000000;
  bVar14 = ((ulong)index & 0x1ffff00000000) == 0x1000000000000;
  result = instance;
  local_38 = index;
  if (bVar14 || bVar13) {
    if (uVar11 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
      ;
      pcVar10 = "(TaggedInt::Is(index))";
      pcVar9 = "TaggedInt::Is(index)";
      uVar12 = 0xe76;
      goto LAB_00aad769;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar12 = 0x2a;
LAB_00aad769:
    bVar3 = Throw::ReportAssert(fileName,uVar12,pcVar10,pcVar9);
    if (!bVar3) goto LAB_00aae7bf;
    *puVar7 = 0;
  }
  if (result == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00aae7bf;
    *puVar7 = 0;
  }
  else {
    if (((ulong)result & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)result & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
      pvVar8 = result;
      goto switchD_00aad979_caseD_1f;
    }
    pvVar8 = result;
    if ((ulong)result >> 0x32 != 0 || ((ulong)result & 0xffff000000000000) == 0x1000000000000)
    goto switchD_00aad979_caseD_1f;
  }
  this = UnsafeVarTo<Js::RecyclableObject>(result);
  if (this == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00aae7bf;
    *puVar7 = 0;
  }
  TVar1 = ((this->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) goto LAB_00aae7bf;
    *puVar7 = 0;
  }
  pvVar8 = result;
  switch(TVar1) {
  case TypeIds_Array:
    arr = UnsafeVarTo<Js::JavascriptArray>(result);
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae1c6;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae1c6:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) {
LAB_00aae7bf:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    iVar5 = OP_GetElementI_ArrayFastPath<Js::JavascriptArray>
                      (arr,(int)local_38,&local_48,scriptContext);
    break;
  case TypeIds_NativeIntArray:
    if (((result != (Var)0x0) &&
        (bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(result), bVar3)) &&
       (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar8),
       this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
    }
    arr_01 = UnsafeVarTo<Js::JavascriptNativeIntArray>(pvVar8);
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae2e3;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae2e3:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    iVar5 = OP_GetElementI_ArrayFastPath<Js::JavascriptNativeIntArray>
                      (arr_01,(int)local_38,&local_48,scriptContext);
    break;
  case TypeIds_CopyOnAccessNativeIntArray:
  case TypeIds_ArrayLastWithES5:
  case TypeIds_Date:
  case TypeIds_RegEx:
  case TypeIds_Error:
  case TypeIds_BooleanObject:
  case TypeIds_NumberObject:
  case TypeIds_StringObject:
  case TypeIds_BigIntObject:
  case TypeIds_SIMDObject:
  case TypeIds_Arguments:
  case TypeIds_ArrayBuffer:
    goto switchD_00aad979_caseD_1f;
  case TypeIds_ArrayLast:
    arr_00 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(result);
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae148;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae148:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    iVar5 = OP_GetElementI_ArrayFastPath<Js::JavascriptNativeFloatArray>
                      (arr_00,(int)local_38,&local_48,scriptContext);
    break;
  case TypeIds_Int8Array:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae09f;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae09f:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<char,_false,_true>_>::Address) {
      this_05 = UnsafeVarTo<Js::TypedArray<char,false,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<char,_false,_true>::DirectGetItem(this_05,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<char,_false,_false>_>::Address) {
      this_14 = UnsafeVarTo<Js::TypedArray<char,false,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<char,_false,_false>::DirectGetItem(this_14,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  case TypeIds_Uint8Array:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae000;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae000:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_true>_>::Address) {
      this_04 = UnsafeVarTo<Js::TypedArray<unsigned_char,false,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<unsigned_char,_false,_true>::DirectGetItem(this_04,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_false>_>::Address) {
      this_13 = UnsafeVarTo<Js::TypedArray<unsigned_char,false,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<unsigned_char,_false,_false>::DirectGetItem(this_13,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  case TypeIds_Uint8ClampedArray:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae367;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae367:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_true>_>::Address) {
      this_07 = UnsafeVarTo<Js::TypedArray<unsigned_char,true,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<unsigned_char,_true,_true>::DirectGetItem(this_07,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_false>_>::Address) {
      this_16 = UnsafeVarTo<Js::TypedArray<unsigned_char,true,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<unsigned_char,_true,_false>::DirectGetItem(this_16,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  case TypeIds_Int16Array:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aadf61;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aadf61:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<short,_false,_true>_>::Address) {
      this_03 = UnsafeVarTo<Js::TypedArray<short,false,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<short,_false,_true>::DirectGetItem(this_03,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<short,_false,_false>_>::Address) {
      this_12 = UnsafeVarTo<Js::TypedArray<short,false,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<short,_false,_false>::DirectGetItem(this_12,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  case TypeIds_Uint16Array:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae406;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae406:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_true>_>::Address) {
      this_08 = UnsafeVarTo<Js::TypedArray<unsigned_short,false,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<unsigned_short,_false,_true>::DirectGetItem(this_08,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_false>_>::Address) {
      this_17 = UnsafeVarTo<Js::TypedArray<unsigned_short,false,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<unsigned_short,_false,_false>::DirectGetItem(this_17,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  case TypeIds_Int32Array:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aadec2;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aadec2:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<int,_false,_true>_>::Address) {
      this_02 = UnsafeVarTo<Js::TypedArray<int,false,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<int,_false,_true>::DirectGetItem(this_02,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<int,_false,_false>_>::Address) {
      this_11 = UnsafeVarTo<Js::TypedArray<int,false,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<int,_false,_false>::DirectGetItem(this_11,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  case TypeIds_Uint32Array:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae4a5;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae4a5:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_true>_>::Address) {
      this_09 = UnsafeVarTo<Js::TypedArray<unsigned_int,false,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<unsigned_int,_false,_true>::DirectGetItem(this_09,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_false>_>::Address) {
      this_18 = UnsafeVarTo<Js::TypedArray<unsigned_int,false,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<unsigned_int,_false,_false>::DirectGetItem(this_18,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  case TypeIds_Float32Array:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aae23a;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae23a:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<float,_false,_true>_>::Address) {
      this_06 = UnsafeVarTo<Js::TypedArray<float,false,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<float,_false,_true>::DirectGetItem(this_06,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<float,_false,_false>_>::Address) {
      this_15 = UnsafeVarTo<Js::TypedArray<float,false,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<float,_false,_false>::DirectGetItem(this_15,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  case TypeIds_Float64Array:
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_00aade23;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aade23:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    if (*result == VirtualTableInfo<Js::TypedArray<double,_false,_true>_>::Address) {
      this_01 = UnsafeVarTo<Js::TypedArray<double,false,true>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<double,_false,_true>::DirectGetItem(this_01,(uint32)local_38);
        return pvVar8;
      }
    }
    else if (*result == VirtualTableInfo<Js::TypedArray<double,_false,_false>_>::Address) {
      this_10 = UnsafeVarTo<Js::TypedArray<double,false,false>>(result);
      if (-1 < (int)(uint32)local_38) {
        pvVar8 = TypedArray<double,_false,_false>::DirectGetItem(this_10,(uint32)local_38);
        return pvVar8;
      }
    }
    goto switchD_00aad979_caseD_1f;
  default:
    if (TVar1 != TypeIds_String) goto switchD_00aad979_caseD_1f;
    if (bVar14 || bVar13) {
      if (uVar11 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar10 = "(Is(aValue))";
        pcVar9 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x51;
        goto LAB_00aae760;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_00aae760:
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,uVar12,pcVar10,pcVar9);
      if (!bVar13) goto LAB_00aae7bf;
      *puVar7 = 0;
    }
    pvVar8 = result;
    this_19 = UnsafeVarTo<Js::JavascriptString>(result);
    PVar6 = JavascriptString::GetItemQuery(this_19,pvVar8,(uint32)local_38,&local_48,scriptContext);
    if (PVar6 == Property_Found) {
      return local_48;
    }
    goto switchD_00aad979_caseD_1f;
  }
  pvVar8 = result;
  if (iVar5 != 0) {
    return local_48;
  }
switchD_00aad979_caseD_1f:
  pvVar8 = GetElementIHelper(pvVar8,local_38,pvVar8,scriptContext);
  return pvVar8;
}

Assistant:

Var JavascriptOperators::GetElementIIntIndex(_In_ Var instance, _In_ Var index, _In_ ScriptContext* scriptContext)
    {
        Assert(TaggedInt::Is(index));

        switch (JavascriptOperators::GetTypeId(instance))
        {
        case TypeIds_Array: //fast path for array
        {
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }
        case TypeIds_NativeIntArray:
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptNativeIntArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }
        case TypeIds_NativeFloatArray:
        {
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptNativeFloatArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }

        case TypeIds_String: // fast path for string
        {
            charcount_t indexInt = TaggedInt::ToUInt32(index);
            JavascriptString* string = UnsafeVarTo<JavascriptString>(instance);
            Var result;
            if (JavascriptConversion::PropertyQueryFlagsToBoolean(string->JavascriptString::GetItemQuery(instance, indexInt, &result, scriptContext)))
            {
                return result;
            }
            break;
        }

        case TypeIds_Int8Array:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Int8VirtualArray>::HasVirtualTable(instance))
            {
                Int8VirtualArray* int8Array = UnsafeVarTo<Int8VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int8Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int8Array>::HasVirtualTable(instance))
            {
                Int8Array* int8Array = UnsafeVarTo<Int8Array>(instance);
                if (indexInt >= 0)
                {
                    return int8Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint8Array:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint8VirtualArray>::HasVirtualTable(instance))
            {
                Uint8VirtualArray* uint8Array = UnsafeVarTo<Uint8VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint8Array>::HasVirtualTable(instance))
            {
                Uint8Array* uint8Array = UnsafeVarTo<Uint8Array>(instance);
                if (indexInt >= 0)
                {
                    return uint8Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint8ClampedArray:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint8ClampedVirtualArray>::HasVirtualTable(instance))
            {
                Uint8ClampedVirtualArray* uint8ClampedArray = UnsafeVarTo<Uint8ClampedVirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8ClampedArray->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint8ClampedArray>::HasVirtualTable(instance))
            {
                Uint8ClampedArray* uint8ClampedArray = UnsafeVarTo<Uint8ClampedArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8ClampedArray->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Int16Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Int16VirtualArray>::HasVirtualTable(instance))
            {
                Int16VirtualArray* int16Array = UnsafeVarTo<Int16VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int16Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int16Array>::HasVirtualTable(instance))
            {
                Int16Array* int16Array = UnsafeVarTo<Int16Array>(instance);
                if (indexInt >= 0)
                {
                    return int16Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint16Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Uint16VirtualArray>::HasVirtualTable(instance))
            {
                Uint16VirtualArray* uint16Array = UnsafeVarTo<Uint16VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint16Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint16Array>::HasVirtualTable(instance))
            {
                Uint16Array* uint16Array = UnsafeVarTo<Uint16Array>(instance);
                if (indexInt >= 0)
                {
                    return uint16Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Int32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Int32VirtualArray>::HasVirtualTable(instance))
            {
                Int32VirtualArray* int32Array = UnsafeVarTo<Int32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int32Array>::HasVirtualTable(instance))
            {
                Int32Array* int32Array = UnsafeVarTo<Int32Array>(instance);
                if (indexInt >= 0)
                {
                    return int32Array->DirectGetItem(indexInt);
                }
            }
            break;

        }
        case TypeIds_Uint32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint32VirtualArray>::HasVirtualTable(instance))
            {
                Uint32VirtualArray* uint32Array = UnsafeVarTo<Uint32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint32Array>::HasVirtualTable(instance))
            {
                Uint32Array* uint32Array = UnsafeVarTo<Uint32Array>(instance);
                if (indexInt >= 0)
                {
                    return uint32Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Float32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Float32VirtualArray>::HasVirtualTable(instance))
            {
                Float32VirtualArray* float32Array = UnsafeVarTo<Float32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return float32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Float32Array>::HasVirtualTable(instance))
            {
                Float32Array* float32Array = UnsafeVarTo<Float32Array>(instance);
                if (indexInt >= 0)
                {
                    return float32Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Float64Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Float64VirtualArray>::HasVirtualTable(instance))
            {
                Float64VirtualArray* float64Array = UnsafeVarTo<Float64VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return float64Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Float64Array>::HasVirtualTable(instance))
            {
                Float64Array* float64Array = UnsafeVarTo<Float64Array>(instance);
                if (indexInt >= 0)
                {
                    return float64Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        default:
            break;
        }
        return JavascriptOperators::GetElementIHelper(instance, index, instance, scriptContext);
    }